

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

int __thiscall application::Chat::run(Chat *this)

{
  int iVar1;
  long lVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  allocator local_71;
  wstring local_70 [32];
  int local_50;
  int w;
  wchar_t local_3c;
  wstring local_38 [4];
  wchar_t ch;
  wstring temp;
  int k;
  Chat *this_local;
  
  std::__cxx11::wstring::wstring(local_38);
  std::operator<<((wostream *)&std::wcout,(wstring *)&this->prompt_);
  while( true ) {
    do {
      local_3c = _getwch(this);
    } while (local_3c == L'\0');
    if (local_3c == L'\x03') break;
    if (local_3c == L'\n') {
      lVar2 = std::__cxx11::wstring::size();
      if (lVar2 != 0) {
        std::__cxx11::wstring::operator=(local_38,(wstring *)&this->input_);
        std::mutex::lock(&this->mut);
        cleanInput(this);
        std::__cxx11::wstring::clear();
        std::operator<<((wostream *)&std::wcout,(wstring *)&this->prompt_);
        std::mutex::unlock(&this->mut);
        pwVar3 = (wchar_t *)std::__cxx11::wstring::c_str();
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring(local_70,pwVar3,&local_71);
        sendMessage(this,(wstring *)local_70);
        std::__cxx11::wstring::~wstring(local_70);
        std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_71);
      }
    }
    else if (local_3c == L'\x7f') {
      lVar2 = std::__cxx11::wstring::size();
      if (lVar2 != 0) {
        std::__cxx11::wstring::pop_back();
        local_50 = getConsoleWidth(this);
        iVar1 = this->promptLastLine_;
        uVar4 = std::__cxx11::wstring::size();
        if ((long)iVar1 + uVar4 % (ulong)(long)local_50 == (long)local_50) {
          moveCursor(this,local_50,1);
          std::operator<<((wostream *)&std::wcout," ");
        }
        else {
          std::operator<<((wostream *)&std::wcout,"\b \b");
        }
      }
    }
    else {
      uVar4 = std::__cxx11::wstring::size();
      if (((uVar4 < 0x100) && (L'\x1f' < local_3c)) &&
         ((local_3c < L'\x80' || (L'\xa0' < local_3c)))) {
        std::operator<<((wostream *)&std::wcout,local_3c);
        std::__cxx11::wstring::push_back((int)this + L'`');
      }
    }
  }
  std::function<void_()>::operator()(&this->beforeExiting_);
  std::__cxx11::wstring::~wstring(local_38);
  return 0;
}

Assistant:

int Chat::run()
{
#ifdef _WIN32
	// for 'case Controls::CTR_V':
	HANDLE hData;
#endif
	int k;
	std::wstring temp;
	wchar_t ch;

	std::wcout << prompt_;

	while (true)
	{
		ch = _getwch();

		switch (ch)
		{
		case Controls::NULL_TERMINATOR:
			continue;
			break;
		case Controls::CTR_C:
			beforeExiting_();
			return 0;
#ifdef _WIN32
		case Controls::CTR_V:
			if (!OpenClipboard(nullptr))
			{
				CloseClipboard();
				break;
			}
			hData = GetClipboardData(CF_UNICODETEXT);
			if (hData == nullptr)
			{
				CloseClipboard();
				break;
			}
			temp = static_cast<wchar_t*>(GlobalLock(hData));
			if (temp.empty())
			{
				CloseClipboard();
				break;
			}
			GlobalUnlock(hData);
			CloseClipboard();

			if (temp.size() + input_.size() > MAX_INPUT_SIZE)
				temp = temp.erase(MAX_INPUT_SIZE - input_.size(), temp.size() - MAX_INPUT_SIZE + input_.size());

			k = 0;
			while (temp.find(L"\r\n", k) != std::string::npos)
			{
				sendMessage(temp.substr(k, temp.find(L"\r\n", k) - k));
				k = temp.find(L"\r\n", k) + 2;
			}

			mut.lock();
			cleanInput();
			// If temp added to input_ before cleanInput(), it removes excessive lines
			input_ += temp.substr(k, temp.find(L"/n") - k);
			std::wcout << prompt_ << input_;
			mut.unlock();
			break;
#endif
		case Controls::BACKSPACE:
			if (input_.size() != 0)
			{
				input_.pop_back();
				int w = getConsoleWidth();
				if (promptLastLine_ + input_.size() % w == w)
				{
#ifdef _WIN32
					moveCursor(w - 1, 1);
					std::wcout << " \b";
					moveCursor(w - 1, 1);
#else
					moveCursor(w, 1);
					std::wcout << " ";
#endif
				}
				else
				{
					std::wcout << "\b \b";
				}
			}
			break;
		case Controls::ENTER:
			// Shipped message comes faster than the end of this case
			// cause this I reset data first and then send the message.
			if (input_.size() == 0)
				break;
			temp = input_;

			mut.lock();
			cleanInput();
			input_.clear();
			std::wcout << prompt_;
			mut.unlock();

			sendMessage(temp.c_str());
			break;
		default:
			if (input_.size() < MAX_INPUT_SIZE && ch > 31 && (ch < 128 || ch > 160))
			{
				std::wcout << ch;
				input_.push_back(ch);
			}
			break;
		}
	}
}